

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O3

void __thiscall QBooleanComboBox::QBooleanComboBox(QBooleanComboBox *this,QWidget *parent)

{
  int iVar1;
  long in_FS_OFFSET;
  QString local_78;
  QIcon local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QComboBox::QComboBox((QComboBox *)this,parent);
  *(undefined ***)this = &PTR_metaObject_0080c3c8;
  *(undefined ***)(this + 0x10) = &PTR__QBooleanComboBox_0080c598;
  QMetaObject::tr((char *)&local_78,(char *)&QComboBox::staticMetaObject,0x6ed10e);
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  local_40 = 2;
  iVar1 = QComboBox::count((QComboBox *)this);
  QIcon::QIcon(&local_60);
  QComboBox::insertItem((QComboBox *)this,iVar1,&local_60,&local_78,(QVariant *)&local_58);
  QIcon::~QIcon(&local_60);
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  QMetaObject::tr((char *)&local_78,(char *)&QComboBox::staticMetaObject,0x6ed114);
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  local_40 = 2;
  iVar1 = QComboBox::count((QComboBox *)this);
  QIcon::QIcon(&local_60);
  QComboBox::insertItem((QComboBox *)this,iVar1,&local_60,&local_78,(QVariant *)&local_58);
  QIcon::~QIcon(&local_60);
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QBooleanComboBox::QBooleanComboBox(QWidget *parent)
    : QComboBox(parent)
{
    addItem(QComboBox::tr("False"));
    addItem(QComboBox::tr("True"));
}